

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlTextWriterWriteRawLen(void)

{
  int iVar1;
  int iVar2;
  int val;
  xmlTextWriterPtr val_00;
  xmlChar *val_01;
  size_t sVar3;
  int local_3c;
  int n_len;
  int len;
  int n_content;
  xmlChar *content;
  int n_writer;
  xmlTextWriterPtr writer;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (content._4_4_ = 0; (int)content._4_4_ < 2; content._4_4_ = content._4_4_ + 1) {
    for (n_len = 0; n_len < 5; n_len = n_len + 1) {
      for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
        iVar1 = xmlMemBlocks();
        val_00 = gen_xmlTextWriterPtr(content._4_4_,0);
        val_01 = gen_const_xmlChar_ptr(n_len,1);
        iVar2 = gen_int(local_3c,2);
        if ((val_01 == (xmlChar *)0x0) || (sVar3 = strlen((char *)val_01), iVar2 <= (int)sVar3 + 1))
        {
          val = xmlTextWriterWriteRawLen(val_00,val_01,iVar2);
          desret_int(val);
          call_tests = call_tests + 1;
          des_xmlTextWriterPtr(content._4_4_,val_00,0);
          des_const_xmlChar_ptr(n_len,val_01,1);
          des_int(local_3c,iVar2,2);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextWriterWriteRawLen",
                   (ulong)(uint)(iVar2 - iVar1));
            ret_val = ret_val + 1;
            printf(" %d",(ulong)content._4_4_);
            printf(" %d",(ulong)(uint)n_len);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlTextWriterWriteRawLen(void) {
    int test_ret = 0;

#if defined(LIBXML_WRITER_ENABLED)
    int mem_base;
    int ret_val;
    xmlTextWriterPtr writer; /* the xmlTextWriterPtr */
    int n_writer;
    xmlChar * content; /* text string */
    int n_content;
    int len; /* length of the text string */
    int n_len;

    for (n_writer = 0;n_writer < gen_nb_xmlTextWriterPtr;n_writer++) {
    for (n_content = 0;n_content < gen_nb_const_xmlChar_ptr;n_content++) {
    for (n_len = 0;n_len < gen_nb_int;n_len++) {
        mem_base = xmlMemBlocks();
        writer = gen_xmlTextWriterPtr(n_writer, 0);
        content = gen_const_xmlChar_ptr(n_content, 1);
        len = gen_int(n_len, 2);
        if ((content != NULL) &&
            (len > (int) strlen((const char *) content) + 1))
            continue;

        ret_val = xmlTextWriterWriteRawLen(writer, (const xmlChar *)content, len);
        desret_int(ret_val);
        call_tests++;
        des_xmlTextWriterPtr(n_writer, writer, 0);
        des_const_xmlChar_ptr(n_content, (const xmlChar *)content, 1);
        des_int(n_len, len, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlTextWriterWriteRawLen",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_writer);
            printf(" %d", n_content);
            printf(" %d", n_len);
            printf("\n");
        }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}